

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void Prn_gen<Blob<256>>(int nbRn,pfHash hash,vector<Blob<256>,_std::allocator<Blob<256>_>_> *hashes)

{
  uint uVar1;
  bool bVar2;
  Blob<256> hcopy;
  Blob<256> h;
  
  printf("Generating %i random numbers : \n",nbRn);
  Blob<256>::Blob(&hcopy);
  uVar1 = ~(nbRn >> 0x1f) & nbRn;
  hcopy.bytes[0] = '\0';
  hcopy.bytes[1] = '\0';
  hcopy.bytes[2] = '\0';
  hcopy.bytes[3] = '\0';
  hcopy.bytes[4] = '\0';
  hcopy.bytes[5] = '\0';
  hcopy.bytes[6] = '\0';
  hcopy.bytes[7] = '\0';
  hcopy.bytes[8] = '\0';
  hcopy.bytes[9] = '\0';
  hcopy.bytes[10] = '\0';
  hcopy.bytes[0xb] = '\0';
  hcopy.bytes[0xc] = '\0';
  hcopy.bytes[0xd] = '\0';
  hcopy.bytes[0xe] = '\0';
  hcopy.bytes[0xf] = '\0';
  hcopy.bytes[0x10] = '\0';
  hcopy.bytes[0x11] = '\0';
  hcopy.bytes[0x12] = '\0';
  hcopy.bytes[0x13] = '\0';
  hcopy.bytes[0x14] = '\0';
  hcopy.bytes[0x15] = '\0';
  hcopy.bytes[0x16] = '\0';
  hcopy.bytes[0x17] = '\0';
  hcopy.bytes[0x18] = '\0';
  hcopy.bytes[0x19] = '\0';
  hcopy.bytes[0x1a] = '\0';
  hcopy.bytes[0x1b] = '\0';
  hcopy.bytes[0x1c] = '\0';
  hcopy.bytes[0x1d] = '\0';
  hcopy.bytes[0x1e] = '\0';
  hcopy.bytes[0x1f] = '\0';
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    Blob<256>::Blob(&h);
    (*hash)(&hcopy,0x20,0,&h);
    std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back(hashes,&h);
    hcopy.bytes[0] = h.bytes[0];
    hcopy.bytes[1] = h.bytes[1];
    hcopy.bytes[2] = h.bytes[2];
    hcopy.bytes[3] = h.bytes[3];
    hcopy.bytes[4] = h.bytes[4];
    hcopy.bytes[5] = h.bytes[5];
    hcopy.bytes[6] = h.bytes[6];
    hcopy.bytes[7] = h.bytes[7];
    hcopy.bytes[8] = h.bytes[8];
    hcopy.bytes[9] = h.bytes[9];
    hcopy.bytes[10] = h.bytes[10];
    hcopy.bytes[0xb] = h.bytes[0xb];
    hcopy.bytes[0xc] = h.bytes[0xc];
    hcopy.bytes[0xd] = h.bytes[0xd];
    hcopy.bytes[0xe] = h.bytes[0xe];
    hcopy.bytes[0xf] = h.bytes[0xf];
    hcopy.bytes[0x10] = h.bytes[0x10];
    hcopy.bytes[0x11] = h.bytes[0x11];
    hcopy.bytes[0x12] = h.bytes[0x12];
    hcopy.bytes[0x13] = h.bytes[0x13];
    hcopy.bytes[0x14] = h.bytes[0x14];
    hcopy.bytes[0x15] = h.bytes[0x15];
    hcopy.bytes[0x16] = h.bytes[0x16];
    hcopy.bytes[0x17] = h.bytes[0x17];
    hcopy.bytes[0x18] = h.bytes[0x18];
    hcopy.bytes[0x19] = h.bytes[0x19];
    hcopy.bytes[0x1a] = h.bytes[0x1a];
    hcopy.bytes[0x1b] = h.bytes[0x1b];
    hcopy.bytes[0x1c] = h.bytes[0x1c];
    hcopy.bytes[0x1d] = h.bytes[0x1d];
    hcopy.bytes[0x1e] = h.bytes[0x1e];
    hcopy.bytes[0x1f] = h.bytes[0x1f];
  }
  return;
}

Assistant:

void Prn_gen (int nbRn, pfHash hash, std::vector<hashtype> & hashes )
{
  assert(nbRn < 0);

  printf("Generating %i random numbers : \n", nbRn);

  hashtype hcopy;
  memset(&hcopy, 0, sizeof(hcopy));

  // a generated random number becomes the input for the next one
  for (int i=0; i< nbRn; i++) {
      hashtype h;
      hash(&hcopy, sizeof(hcopy), 0, &h);
      hashes.push_back(h);
      memcpy(&hcopy, &h, sizeof(h));
  }
}